

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Driver.c
# Opt level: O1

DdManager * Llb_DriverLastPartition(Aig_Man_t *p,Vec_Int_t *vVarsNs,abctime TimeTarget)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  DdManager *unique;
  DdNode *pDVar3;
  DdNode *pDVar4;
  int *piVar5;
  int i;
  long lVar6;
  DdNode *f;
  
  unique = Cudd_Init(p->vObjs->nSize,0,0x100,0x40000,0);
  Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
  unique->TimeStop = TimeTarget;
  pDVar3 = Cudd_ReadOne(unique);
  Cudd_Ref(pDVar3);
  if (0 < vVarsNs->nSize) {
    lVar6 = 0;
    f = pDVar3;
    do {
      pVVar2 = p->vObjs;
      if (pVVar2 == (Vec_Ptr_t *)0x0) {
        piVar5 = (int *)0x0;
      }
      else {
        uVar1 = vVarsNs->pArray[lVar6];
        if (((int)uVar1 < 0) || (pVVar2->nSize <= (int)uVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        piVar5 = (int *)pVVar2->pArray[uVar1];
      }
      pDVar3 = f;
      if (((piVar5[6] & 7U) == 3) && (p->nTruePos <= *piVar5)) {
        pDVar3 = Cudd_bddIthVar(unique,piVar5[9]);
        if (*(ulong *)(piVar5 + 2) == 0) {
          i = -1;
        }
        else {
          i = *(int *)((*(ulong *)(piVar5 + 2) & 0xfffffffffffffffe) + 0x24);
        }
        pDVar4 = Cudd_bddIthVar(unique,i);
        if ((*(uint *)((*(ulong *)(piVar5 + 2) & 0xfffffffffffffffe) + 0x18) & 7) == 1) {
          pDVar4 = Cudd_ReadOne(unique);
        }
        pDVar4 = Cudd_bddXnor(unique,pDVar3,
                              (DdNode *)
                              ((ulong)((uint)*(undefined8 *)(piVar5 + 2) & 1) ^ (ulong)pDVar4));
        Cudd_Ref(pDVar4);
        pDVar3 = Cudd_bddAnd(unique,f,pDVar4);
        if (pDVar3 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(unique,f);
          Cudd_RecursiveDeref(unique,pDVar4);
          return (DdManager *)0x0;
        }
        Cudd_Ref(pDVar3);
        Cudd_RecursiveDeref(unique,f);
        Cudd_RecursiveDeref(unique,pDVar4);
      }
      lVar6 = lVar6 + 1;
      f = pDVar3;
    } while (lVar6 < vVarsNs->nSize);
  }
  Cudd_AutodynDisable(unique);
  unique->bFunc = pDVar3;
  unique->TimeStop = 0;
  return unique;
}

Assistant:

DdManager * Llb_DriverLastPartition( Aig_Man_t * p, Vec_Int_t * vVarsNs, abctime TimeTarget )
{
//    int fVerbose = 1;
    DdManager * dd;
    DdNode * bVar1, * bVar2, * bProd, * bRes, * bTemp;
    Aig_Obj_t * pObj;
    int i;
    dd = Cudd_Init( Aig_ManObjNumMax(p), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_AutodynEnable( dd, CUDD_REORDER_SYMM_SIFT );
    dd->TimeStop = TimeTarget;
    bRes = Cudd_ReadOne(dd);                                   Cudd_Ref( bRes );

    // mark the duplicated flop inputs
    Aig_ManForEachObjVec( vVarsNs, p, pObj, i )
    {
        if ( !Saig_ObjIsLi(p, pObj) )
            continue;
        bVar1 = Cudd_bddIthVar( dd, Aig_ObjId(pObj) );
        bVar2 = Cudd_bddIthVar( dd, Aig_ObjFaninId0(pObj) );
        if ( Aig_ObjIsConst1(Aig_ObjFanin0(pObj)) )
            bVar2 = Cudd_ReadOne(dd);
        bVar2 = Cudd_NotCond( bVar2, Aig_ObjFaninC0(pObj) );
        bProd = Cudd_bddXnor( dd, bVar1, bVar2 );              Cudd_Ref( bProd );
//        bRes  = Cudd_bddAnd( dd, bTemp = bRes, bProd );        Cudd_Ref( bRes );
//        bRes  = Extra_bddAndTime( dd, bTemp = bRes, bProd, TimeTarget );  
        bRes  = Cudd_bddAnd( dd, bTemp = bRes, bProd );  
        if ( bRes == NULL )
        {
            Cudd_RecursiveDeref( dd, bTemp );
            Cudd_RecursiveDeref( dd, bProd );
            return NULL;
        }        
        Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bProd );
    }

/*
    Saig_ManForEachLi( p, pObj, i )
        printf( "%d ", Aig_ObjId(pObj) );
    printf( "\n" );
    Saig_ManForEachLi( p, pObj, i )
        printf( "%c%d ", Aig_ObjFaninC0(pObj)? '-':'+', Aig_ObjFaninId0(pObj) );
    printf( "\n" );
*/
    Cudd_AutodynDisable( dd );
//    Cudd_RecursiveDeref( dd, bRes );
//    Extra_StopManager( dd );
    dd->bFunc = bRes;
    dd->TimeStop = 0;
    return dd;
}